

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t ustrcase_internalToUpper_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *param_3,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  int32_t iVar1;
  undefined1 local_58 [8];
  UCaseContext csc;
  int32_t destIndex;
  UChar *src_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  BreakIterator *param_2_local;
  uint32_t options_local;
  int32_t caseLocale_local;
  
  if (caseLocale == 4) {
    csc._28_4_ = icu_63::GreekUpper::toUpper
                           (options,dest,destCapacity,src,srcLength,edits,errorCode);
  }
  else {
    memset(local_58,0,0x20);
    csc.start = srcLength;
    local_58 = (undefined1  [8])src;
    csc._28_4_ = icu_63::anon_unknown_10::toUpper
                           (caseLocale,options,dest,destCapacity,src,(UCaseContext *)local_58,
                            srcLength,edits,errorCode);
  }
  iVar1 = icu_63::anon_unknown_10::checkOverflowAndEditsError
                    (csc._28_4_,destCapacity,edits,errorCode);
  return iVar1;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToUpper(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_UNUSED
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    int32_t destIndex;
    if (caseLocale == UCASE_LOC_GREEK) {
        destIndex = GreekUpper::toUpper(options, dest, destCapacity,
                                        src, srcLength, edits, errorCode);
    } else {
        UCaseContext csc=UCASECONTEXT_INITIALIZER;
        csc.p=(void *)src;
        csc.limit=srcLength;
        destIndex = toUpper(
            caseLocale, options,
            dest, destCapacity,
            src, &csc, srcLength,
            edits, errorCode);
    }
    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}